

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

uint strHash(char *z)

{
  uint local_14;
  uchar c;
  byte *pbStack_10;
  uint h;
  char *z_local;
  
  local_14 = 0;
  pbStack_10 = (byte *)z;
  while( true ) {
    if (*pbStack_10 == 0) break;
    local_14 = (""[*pbStack_10] + local_14) * -0x61c8864f;
    pbStack_10 = pbStack_10 + 1;
  }
  return local_14;
}

Assistant:

static unsigned int strHash(const char *z){
  unsigned int h = 0;
  unsigned char c;
  while( (c = (unsigned char)*z++)!=0 ){     /*OPTIMIZATION-IF-TRUE*/
    /* Knuth multiplicative hashing.  (Sorting & Searching, p. 510).
    ** 0x9e3779b1 is 2654435761 which is the closest prime number to
    ** (2**32)*golden_ratio, where golden_ratio = (sqrt(5) - 1)/2. */
    h += sqlite3UpperToLower[c];
    h *= 0x9e3779b1;
  }
  return h;
}